

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcache_test.cc
# Opt level: O3

void multi_thread_test(int nblocks,int cachesize,int blocksize,int time_sec,int nwriters,
                      int nreaders)

{
  pthread_t __th;
  size_t __nmemb;
  size_t len;
  undefined8 uVar1;
  uint32_t uVar2;
  ulong uVar3;
  bid_t *data;
  filemgr_ops *ops;
  filemgr *file;
  ulong uVar4;
  void **ppvVar5;
  pthread_t *ppVar6;
  int iVar7;
  ulong *__arg;
  void **__thread_return;
  bid_t bid;
  pthread_t *__newthread;
  filemgr_open_result fVar8;
  void *pvStack_e0;
  filemgr_config local_d8;
  undefined1 local_78 [8];
  timeval __test_begin;
  
  pvStack_e0 = (void *)0x1028ac;
  gettimeofday((timeval *)local_78,(__timezone_ptr_t)0x0);
  iVar7 = nreaders + nwriters;
  uVar4 = (ulong)iVar7;
  uVar3 = uVar4 * 8 + 0xf & 0xfffffffffffffff0;
  ppVar6 = (pthread_t *)((long)&local_d8 - uVar3);
  __arg = (ulong *)((long)ppVar6 - (uVar4 * 0x28 + 0xf & 0xfffffffffffffff0));
  ppvVar5 = (void **)((long)__arg - uVar3);
  ppvVar5[-1] = (void *)0x102904;
  system("rm -rf  bcache_testfile");
  ppvVar5[-1] = (void *)0x102909;
  memleak_start();
  ppvVar5[-1] = (void *)0x1;
  __nmemb = (size_t)ppvVar5[-1];
  ppvVar5[-1] = (void *)0x102916;
  data = (bid_t *)calloc(__nmemb,0x1000);
  local_d8.flag = 0;
  local_d8.chunksize = 0;
  local_d8.prefetch_duration = 0;
  local_d8.encryption_key.bytes[0] = '\0';
  local_d8.encryption_key.bytes[1] = '\0';
  local_d8.encryption_key.bytes[2] = '\0';
  local_d8.encryption_key.bytes[3] = '\0';
  local_d8.encryption_key.bytes[4] = '\0';
  local_d8.encryption_key.bytes[5] = '\0';
  local_d8.encryption_key.bytes[6] = '\0';
  local_d8.encryption_key.bytes[7] = '\0';
  local_d8.encryption_key.bytes[8] = '\0';
  local_d8.encryption_key.bytes[9] = '\0';
  local_d8.encryption_key.bytes[10] = '\0';
  local_d8.encryption_key.bytes[0xb] = '\0';
  local_d8.encryption_key.bytes[0xc] = '\0';
  local_d8.encryption_key.bytes[0xd] = '\0';
  local_d8.encryption_key.bytes[0xe] = '\0';
  local_d8.encryption_key.bytes[0xf] = '\0';
  local_d8.encryption_key.bytes[0x10] = '\0';
  local_d8.encryption_key.bytes[0x11] = '\0';
  local_d8.encryption_key.bytes[0x12] = '\0';
  local_d8.encryption_key.bytes[0x13] = '\0';
  local_d8.encryption_key.bytes[0x14] = '\0';
  local_d8.encryption_key.bytes[0x15] = '\0';
  local_d8.encryption_key.bytes[0x16] = '\0';
  local_d8.encryption_key.bytes[0x17] = '\0';
  local_d8.encryption_key.bytes[0x18] = '\0';
  local_d8.encryption_key.bytes[0x19] = '\0';
  local_d8.encryption_key.bytes[0x1a] = '\0';
  local_d8.encryption_key.bytes[0x1b] = '\0';
  local_d8.encryption_key.bytes[0x1c] = '\0';
  local_d8.encryption_key.bytes[0x1d] = '\0';
  local_d8.encryption_key.bytes[0x1e] = '\0';
  local_d8.encryption_key.bytes[0x1f] = '\0';
  local_d8.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_d8.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_d8.do_not_cache_doc_blocks = false;
  local_d8._89_3_ = 0;
  local_d8.num_blocks_readahead = 0;
  local_d8.options = '\b';
  local_d8.seqtree_opt = '\0';
  local_d8._18_6_ = 0;
  local_d8.num_wal_shards = 8;
  local_d8.num_bcache_shards = 0;
  local_d8.encryption_key.algorithm = 0;
  local_d8.blocksize = blocksize;
  local_d8.ncacheblock = cachesize;
  ppvVar5[-1] = (void *)0x10295c;
  ops = get_filemgr_ops();
  ppvVar5[-1] = (void *)0x102970;
  fVar8 = filemgr_open("./bcache_testfile",ops,&local_d8,(err_log_callback *)0x0);
  file = fVar8.file;
  if (nblocks != 0) {
    bid = 0;
    do {
      *data = bid;
      data[1] = 0;
      ppvVar5[-1] = (void *)0x10;
      len = (size_t)ppvVar5[-1];
      ppvVar5[-1] = (void *)0x102995;
      uVar2 = crc32_8(data,len,0);
      *(uint32_t *)(data + 2) = uVar2;
      ppvVar5[-1] = (void *)0x1;
      uVar1 = ppvVar5[-1];
      ppvVar5[-1] = (void *)0x1029b0;
      bcache_write(file,bid,data,(bcache_dirty_t)uVar1,false,false);
      bid = bid + 1;
    } while ((long)nblocks != bid);
  }
  if (iVar7 == 0) {
    ppvVar5[-1] = (void *)0x1029d6;
    printf("wait for %d seconds..\n",(ulong)(uint)time_sec);
  }
  else {
    __test_begin.tv_usec = (__suseconds_t)time_sec;
    uVar3 = 0;
    __newthread = ppVar6;
    do {
      *__arg = uVar3;
      __arg[1] = (ulong)file;
      __arg[2] = (ulong)(uVar3 < (ulong)(long)nwriters);
      __arg[3] = (long)nblocks;
      __arg[4] = __test_begin.tv_usec;
      ppvVar5[-1] = (void *)0x102a2a;
      pthread_create(__newthread,(pthread_attr_t *)0x0,worker,__arg);
      uVar3 = uVar3 + 1;
      __newthread = __newthread + 1;
      __arg = __arg + 5;
    } while (uVar4 != uVar3);
    ppvVar5[-1] = (void *)0x102a4f;
    printf("wait for %d seconds..\n",(ulong)(uint)time_sec);
    if (iVar7 != 0) {
      uVar3 = 0;
      __thread_return = ppvVar5;
      do {
        __th = ppVar6[uVar3];
        ppvVar5[-1] = (void *)0x102a70;
        pthread_join(__th,__thread_return);
        uVar3 = uVar3 + 1;
        __thread_return = __thread_return + 1;
      } while (uVar4 != uVar3);
    }
  }
  ppvVar5[-1] = (void *)0x1;
  uVar1 = ppvVar5[-1];
  ppvVar5[-1] = (void *)0x102a8f;
  filemgr_commit(file,SUB81(uVar1,0),(err_log_callback *)0x0);
  ppvVar5[-1] = (void *)0x102a9d;
  filemgr_close(file,SUB81(uVar1,0),(char *)0x0,(err_log_callback *)0x0);
  ppvVar5[-1] = (void *)0x102aa2;
  filemgr_shutdown();
  ppvVar5[-1] = (void *)0x102aaa;
  free(data);
  ppvVar5[-1] = (void *)0x102aaf;
  memleak_end();
  ppvVar5[-1] = (void *)0x102ace;
  fprintf(_stderr,"%s PASSED\n","multi thread test");
  return;
}

Assistant:

void multi_thread_test(
    int nblocks, int cachesize, int blocksize, int time_sec, int nwriters, int nreaders)
{
    TEST_INIT();

    struct filemgr *file;
    struct filemgr_config config;
    int n = nwriters + nreaders;
    uint64_t i, j;
    uint32_t crc;
    uint8_t *buf;
    int r;
    char *fname = (char *) "./bcache_testfile";
    thread_t *tid = alca(thread_t, n);
    struct worker_args *args = alca(struct worker_args, n);
    void **ret = alca(void *, n);

    r = system(SHELL_DEL " bcache_testfile");
    (void)r;

    memleak_start();

    buf = (uint8_t *)malloc(4096);
    memset(buf, 0, 4096);

    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = cachesize;
    config.flag = 0x0;
    config.options = FILEMGR_CREATE;
    config.num_wal_shards = 8;
    filemgr_open_result result = filemgr_open(fname, get_filemgr_ops(), &config, NULL);
    file = result.file;

    for (i=0;i<(uint64_t)nblocks;++i) {
        memcpy(buf, &i, sizeof(i));
        j = 0;
        memcpy(buf + sizeof(i), &j, sizeof(j));
        crc = crc32_8(buf, sizeof(i) + sizeof(j), 0);
        memcpy(buf + sizeof(i) + sizeof(j), &crc, sizeof(crc));
        bcache_write(file, (bid_t)i, buf, BCACHE_REQ_DIRTY, false, false);
    }

    for (i=0;i<(uint64_t)n;++i){
        args[i].n = i;
        args[i].file = file;
        args[i].writer = ((i<(uint64_t)nwriters)?(1):(0));
        args[i].nblocks = nblocks;
        args[i].time_sec = time_sec;
        thread_create(&tid[i], worker, &args[i]);
    }

    DBG("wait for %d seconds..\n", time_sec);
    for (i=0;i<(uint64_t)n;++i){
        thread_join(tid[i], &ret[i]);
    }

    filemgr_commit(file, true, NULL);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();
    free(buf);

    memleak_end();
    TEST_RESULT("multi thread test");
}